

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ProgramSources * deqp::gles3::Performance::anon_unknown_0::Utils::getBaseShader(void)

{
  ProgramSources *in_RDI;
  string local_50;
  string local_30;
  
  Performance::(anonymous_namespace)::Utils::getBaseVertexShader_abi_cxx11_();
  Performance::(anonymous_namespace)::Utils::getDepthAsGreenFragmentShader_abi_cxx11_();
  glu::makeVtxFragSources(in_RDI,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

glu::ProgramSources getBaseShader (void)
	{
		return glu::makeVtxFragSources(getBaseVertexShader(), getDepthAsGreenFragmentShader());
	}